

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O1

void anon_unknown.dwarf_7e6f::test_art_iterator_erase(void **param_1)

{
  unsigned_long uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  pointer pVVar4;
  art_val_t *paVar5;
  pointer pVVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  initializer_list<unsigned_long> __l;
  art_t art;
  vector<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_> keys;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  art_iterator_t iterator;
  art_t local_120;
  array<unsigned_char,_6UL> *local_118;
  iterator iStack_110;
  array<unsigned_char,_6UL> *local_108;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  pointer local_c0;
  art_iterator_t local_b8;
  
  local_118 = (array<unsigned_char,_6UL> *)0x0;
  iStack_110._M_current = (array<unsigned_char,_6UL> *)0x0;
  local_108 = (array<unsigned_char,_6UL> *)0x0;
  local_f8.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.depth = '\x10';
  local_b8.frame = '\0';
  local_b8._18_6_ = 0;
  local_b8.frames[0].node = (art_node_t *)0x30;
  local_b8.key[0] = '\x01';
  local_b8.key[1] = '\0';
  local_b8.key[2] = '\0';
  local_b8.key[3] = '\0';
  local_b8.key[4] = '\0';
  local_b8.key[5] = '\0';
  local_b8._6_2_ = 0;
  local_b8.value = (art_val_t *)0x4;
  local_b8.frames[0].index_in_node = '\0';
  local_b8.frames[0]._9_7_ = 1;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_d8,__l,(allocator_type *)&local_120);
  if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      uVar1 = local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      if ((ulong)(byte)uVar1 != 0) {
        pVVar6 = (pointer)0x0;
        uVar8 = 0;
        do {
          uVar3 = local_b8._0_8_;
          local_b8.key._0_4_ = (uint)(byte)uVar7 << 0x18;
          uVar2 = local_b8.key._0_4_;
          local_b8._6_2_ = SUB82(uVar3,6);
          local_b8.key = (art_key_chunk_t  [6])((uint6)CONCAT11((byte)uVar8,(byte)uVar7) << 0x18);
          uVar3 = local_b8._0_8_;
          if (iStack_110._M_current == local_108) {
            std::vector<std::array<unsigned_char,6ul>,std::allocator<std::array<unsigned_char,6ul>>>
            ::_M_realloc_insert<std::array<unsigned_char,6ul>>
                      ((vector<std::array<unsigned_char,6ul>,std::allocator<std::array<unsigned_char,6ul>>>
                        *)&local_118,iStack_110,(array<unsigned_char,_6UL> *)&local_b8);
          }
          else {
            local_b8.key[5] = '\0';
            local_b8.key[4] = (byte)uVar8;
            *(undefined2 *)((iStack_110._M_current)->_M_elems + 4) = local_b8.key._4_2_;
            *(undefined4 *)(iStack_110._M_current)->_M_elems = uVar2;
            iStack_110._M_current = iStack_110._M_current + 1;
            local_b8._0_8_ = uVar3;
          }
          local_b8.value = (art_val_t *)pVVar6;
          std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
          push_back(&local_f8,(value_type *)&local_b8);
          uVar8 = uVar8 + 1;
          pVVar6 = (pointer)((pVVar6->super_art_val_t).key + uVar7);
        } while ((byte)uVar1 != uVar8);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)local_d8.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_d8.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_120.root = (art_node_t *)0x0;
  if (iStack_110._M_current != local_118) {
    lVar9 = 0;
    uVar7 = 0;
    pVVar6 = local_f8.
             super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      art_insert(&local_120,local_118->_M_elems + lVar9,(art_val_t *)pVVar6);
      assert_art_valid((art_t *)&local_120);
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 6;
      pVVar6 = pVVar6 + 1;
    } while (uVar7 < (ulong)(((long)iStack_110._M_current - (long)local_118 >> 1) *
                            -0x5555555555555555));
  }
  art_init_iterator(&local_b8,&local_120,true);
  lVar10 = 0;
  local_c0 = local_f8.
             super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = 0;
  pVVar6 = local_f8.
           super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    assert_key_eq(local_b8.key,local_118->_M_elems + lVar10);
    _assert_true((ulong)(pVVar6 == (pointer)local_b8.value),"iterator.value == &values[i]",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
                 ,0x21c);
    pVVar4 = (pointer)art_iterator_erase(&local_120,&local_b8);
    _assert_true((ulong)(pVVar6 == pVVar4),"art_iterator_erase(&art, &iterator) == &values[i]",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
                 ,0x21d);
    assert_art_valid((art_t *)&local_120);
    paVar5 = art_find(&local_120,local_118->_M_elems + lVar10);
    _assert_true((ulong)(paVar5 == (art_val_t *)0x0),
                 "art_find(&art, (art_key_chunk_t*)keys[i].data())",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
                 ,0x21f);
    pVVar4 = local_c0;
    lVar9 = lVar9 + 1;
    lVar10 = lVar10 + 6;
    pVVar6 = pVVar6 + 1;
  } while ((pointer)local_b8.value != (pointer)0x0);
  _assert_true((ulong)((long)local_f8.
                             super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)local_c0 >> 4 ==
                      lVar9),"i == values.size()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x222);
  art_free(&local_120);
  if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (pVVar4 != (pointer)0x0) {
    operator_delete(pVVar4);
  }
  if (local_118 != (array<unsigned_char,_6UL> *)0x0) {
    operator_delete(local_118);
  }
  return;
}

Assistant:

void erase(Key key) {
        art_erase(&art_, key.data());
        shadow_.erase(key);
    }